

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_hand.cc
# Opt level: O0

void __thiscall
hanabi_learning_env::HanabiHand::ValueKnowledge::ApplyIsValueHint(ValueKnowledge *this,int value)

{
  _Bit_iterator __last;
  bool *pbVar1;
  int in_ESI;
  int *in_RDI;
  vector<bool,_std::allocator<bool>_> *this_00;
  bool bVar2;
  bool *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar3;
  _Bit_reference in_stack_ffffffffffffff88;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffa0;
  reference local_20;
  int local_c;
  
  uVar3 = false;
  local_c = in_ESI;
  if (-1 < in_ESI) {
    in_stack_ffffffffffffff70 = (bool *)(long)in_ESI;
    pbVar1 = (bool *)std::vector<bool,_std::allocator<bool>_>::size(in_stack_ffffffffffffffa0);
    uVar3 = in_stack_ffffffffffffff70 < pbVar1;
  }
  if ((bool)uVar3 == false) {
    __assert_fail("value >= 0 && value < value_plausible_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_hand.cc"
                  ,0x1e,
                  "void hanabi_learning_env::HanabiHand::ValueKnowledge::ApplyIsValueHint(int)");
  }
  bVar2 = true;
  if (-1 < *in_RDI) {
    bVar2 = *in_RDI == local_c;
  }
  if (!bVar2) {
    __assert_fail("value_ < 0 || value_ == value",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_hand.cc"
                  ,0x1f,
                  "void hanabi_learning_env::HanabiHand::ValueKnowledge::ApplyIsValueHint(int)");
  }
  local_20 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT17(uVar3,in_stack_ffffffffffffff80),(size_type)in_RDI);
  bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_20);
  if (bVar2) {
    *in_RDI = local_c;
    this_00 = (vector<bool,_std::allocator<bool>_> *)(in_RDI + 2);
    std::vector<bool,_std::allocator<bool>_>::begin((vector<bool,_std::allocator<bool>_> *)0x145fc5)
    ;
    std::vector<bool,_std::allocator<bool>_>::end(this_00);
    __last.super__Bit_iterator_base._8_7_ = in_stack_ffffffffffffff80;
    __last.super__Bit_iterator_base._M_p = (_Bit_type *)in_RDI;
    __last.super__Bit_iterator_base._15_1_ = uVar3;
    std::fill<std::_Bit_iterator,bool>
              ((_Bit_iterator)in_stack_ffffffffffffff88,__last,in_stack_ffffffffffffff70);
    std::vector<bool,_std::allocator<bool>_>::operator[]
              ((vector<bool,_std::allocator<bool>_> *)CONCAT17(uVar3,in_stack_ffffffffffffff80),
               (size_type)in_RDI);
    std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffff88,true);
    return;
  }
  __assert_fail("value_plausible_[value] == true",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_hand.cc"
                ,0x20,"void hanabi_learning_env::HanabiHand::ValueKnowledge::ApplyIsValueHint(int)")
  ;
}

Assistant:

void HanabiHand::ValueKnowledge::ApplyIsValueHint(int value) {
  assert(value >= 0 && value < value_plausible_.size());
  assert(value_ < 0 || value_ == value);
  assert(value_plausible_[value] == true);
  value_ = value;
  std::fill(value_plausible_.begin(), value_plausible_.end(), false);
  value_plausible_[value] = true;
}